

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

_Bool Hacl_P256_compressed_to_raw(uint8_t *pk,uint8_t *pk_raw)

{
  _Bool _Var1;
  _Bool b;
  uint8_t *pk_xb;
  uint64_t ya [4];
  uint64_t xa [4];
  uint8_t *pk_raw_local;
  uint8_t *pk_local;
  
  memset(ya + 3,0,0x20);
  memset(&pk_xb,0,0x20);
  _Var1 = aff_point_decompress_vartime(ya + 3,(uint64_t *)&pk_xb,pk);
  if (_Var1) {
    *(undefined8 *)pk_raw = *(undefined8 *)(pk + 1);
    *(undefined8 *)(pk_raw + 8) = *(undefined8 *)(pk + 9);
    *(undefined8 *)(pk_raw + 0x10) = *(undefined8 *)(pk + 0x11);
    *(undefined8 *)(pk_raw + 0x18) = *(undefined8 *)(pk + 0x19);
    bn_to_bytes_be4(pk_raw + 0x20,(uint64_t *)&pk_xb);
  }
  return _Var1;
}

Assistant:

bool Hacl_P256_compressed_to_raw(uint8_t *pk, uint8_t *pk_raw)
{
  uint64_t xa[4U] = { 0U };
  uint64_t ya[4U] = { 0U };
  uint8_t *pk_xb = pk + 1U;
  bool b = aff_point_decompress_vartime(xa, ya, pk);
  if (b)
  {
    memcpy(pk_raw, pk_xb, 32U * sizeof (uint8_t));
    bn_to_bytes_be4(pk_raw + 32U, ya);
  }
  return b;
}